

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_SetBlendMode(GPU_Image *image,GPU_BlendPresetEnum preset)

{
  GPU_BlendMode local_28;
  
  if (image != (GPU_Image *)0x0) {
    GPU_GetBlendModeFromPreset(&local_28,preset);
    (image->blend_mode).source_color = local_28.source_color;
    (image->blend_mode).dest_color = local_28.dest_color;
    (image->blend_mode).source_alpha = local_28.source_alpha;
    (image->blend_mode).dest_alpha = local_28.dest_alpha;
    (image->blend_mode).color_equation = local_28.color_equation;
    (image->blend_mode).alpha_equation = local_28.alpha_equation;
  }
  return;
}

Assistant:

void GPU_SetBlendMode(GPU_Image* image, GPU_BlendPresetEnum preset)
{
    GPU_BlendMode b;
    if(image == NULL)
        return;

    b = GPU_GetBlendModeFromPreset(preset);
    GPU_SetBlendFunction(image, b.source_color, b.dest_color, b.source_alpha, b.dest_alpha);
    GPU_SetBlendEquation(image, b.color_equation, b.alpha_equation);
}